

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

string<unsigned_short> * __thiscall
irr::core::string<unsigned_short>::operator=
          (string<unsigned_short> *this,string<unsigned_short> *other)

{
  int iVar1;
  unsigned_short *puVar2;
  s32 i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this != other) {
    if (this->array != (unsigned_short *)0x0) {
      operator_delete__(this->array);
    }
    iVar1 = other->used;
    uVar5 = (ulong)iVar1;
    this->used = iVar1;
    this->allocated = iVar1;
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)uVar5) {
      uVar4 = uVar5 * 2;
    }
    puVar2 = (unsigned_short *)operator_new__(uVar4);
    this->array = puVar2;
    puVar2 = other->array;
    for (lVar3 = 0; lVar3 < (int)uVar5; lVar3 = lVar3 + 1) {
      this->array[lVar3] = puVar2[lVar3];
      uVar5 = (ulong)(uint)this->used;
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const string<T>& other) 
	{
		if (this == &other)
			return *this;

		delete [] array;
		allocated = used = other.size()+1;
		array = new T[used];

		const T* p = other.c_str();
		for (s32 i=0; i<used; ++i, ++p)
			array[i] = *p;

		return *this;
	}